

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blacklist.c
# Opt level: O1

int ipv4_key_cmp(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = -(uint)(a < b) | 1;
  if (a == b) {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static int ipv4_key_cmp(const void *a, const void *b)
{
     if (a == b)
         return 0;
     else if (a< b)
         return -1;
     else
         return 1; 
}